

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O2

void addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
               (NeuralNetwork *nn,int64_t defaultValue,int64_t minValue,int64_t maxValue,
               set<long,_std::less<long>,_std::allocator<long>_> *allowedValues)

{
  NetworkUpdateParameters *this;
  BoolParameter *pBVar1;
  Int64Parameter *this_00;
  Int64Set *this_01;
  _Base_ptr p_Var2;
  Int64Range *pIVar3;
  
  this = CoreML::Specification::NeuralNetwork::mutable_updateparams(nn);
  pBVar1 = CoreML::Specification::NetworkUpdateParameters::mutable_shuffle(this);
  pBVar1->defaultvalue_ = true;
  this_00 = CoreML::Specification::NetworkUpdateParameters::mutable_seed(this);
  this_00->defaultvalue_ = defaultValue;
  if ((allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pIVar3 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
    pIVar3->minvalue_ = minValue;
    pIVar3->maxvalue_ = maxValue;
  }
  else {
    this_01 = CoreML::Specification::Int64Parameter::mutable_set(this_00);
    for (p_Var2 = (allowedValues->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(allowedValues->_M_t)._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      CoreML::Specification::Int64Set::add_values(this_01,*(int64 *)(p_Var2 + 1));
    }
  }
  return;
}

Assistant:

void addShuffleAndSeed(NeuralNetworkClass *nn, int64_t defaultValue, int64_t minValue,  int64_t maxValue, std::set<int64_t> allowedValues) {
    auto updateParameters = nn->mutable_updateparams();
    auto shuffle = updateParameters->mutable_shuffle();
    shuffle->set_defaultvalue(true);

    auto shuffleSeed = updateParameters->mutable_seed();
    shuffleSeed->set_defaultvalue(defaultValue);

    if (allowedValues.size() == 0) {
        auto int64Range = shuffleSeed->mutable_range();
        int64Range->set_minvalue(minValue);
        int64Range->set_maxvalue(maxValue);
    }
    else {
        auto int64Set = shuffleSeed->mutable_set();
        for (auto& x : allowedValues) {
            int64Set->add_values(x);
        }
    }
}